

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprIsInteger(Expr *p,int *pValue)

{
  int iVar1;
  int local_28;
  int local_24;
  int v;
  int rc;
  int *pValue_local;
  Expr *p_local;
  
  local_24 = 0;
  if (p == (Expr *)0x0) {
    p_local._4_4_ = 0;
  }
  else if ((p->flags & 0x400) == 0) {
    _v = pValue;
    pValue_local = (int *)p;
    if (p->op == 0xa5) {
      iVar1 = sqlite3ExprIsInteger(p->pLeft,&local_28);
      if (iVar1 != 0) {
        *_v = -local_28;
        local_24 = 1;
      }
    }
    else if (p->op == 0xa6) {
      local_24 = sqlite3ExprIsInteger(p->pLeft,pValue);
    }
    p_local._4_4_ = local_24;
  }
  else {
    *pValue = (p->u).iValue;
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIsInteger(Expr *p, int *pValue){
  int rc = 0;
  if( NEVER(p==0) ) return 0;  /* Used to only happen following on OOM */

  /* If an expression is an integer literal that fits in a signed 32-bit
  ** integer, then the EP_IntValue flag will have already been set */
  assert( p->op!=TK_INTEGER || (p->flags & EP_IntValue)!=0
           || sqlite3GetInt32(p->u.zToken, &rc)==0 );

  if( p->flags & EP_IntValue ){
    *pValue = p->u.iValue;
    return 1;
  }
  switch( p->op ){
    case TK_UPLUS: {
      rc = sqlite3ExprIsInteger(p->pLeft, pValue);
      break;
    }
    case TK_UMINUS: {
      int v;
      if( sqlite3ExprIsInteger(p->pLeft, &v) ){
        assert( v!=(-2147483647-1) );
        *pValue = -v;
        rc = 1;
      }
      break;
    }
    default: break;
  }
  return rc;
}